

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall Mesh::Mesh(Mesh *this,int32_t positionLoc,int32_t normalLoc,int32_t texCoordLoc)

{
  int32_t texCoordLoc_local;
  int32_t normalLoc_local;
  int32_t positionLoc_local;
  Mesh *this_local;
  
  this->m_vertices = 0;
  this->m_indices = 0;
  this->m_positionLoc = positionLoc;
  this->m_normalLoc = normalLoc;
  this->m_texCoordLoc = texCoordLoc;
  VertexArray::VertexArray(&this->m_vao);
  std::vector<float,_std::allocator<float>_>::vector(&this->m_verticesData);
  std::vector<float,_std::allocator<float>_>::vector(&this->m_normals);
  std::vector<float,_std::allocator<float>_>::vector(&this->m_texCoords);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_indicesData);
  this->m_drawMode = 4;
  return;
}

Assistant:

Mesh::Mesh(int32_t positionLoc,
           int32_t normalLoc  ,
           int32_t texCoordLoc)
  : m_vertices(0),
    m_indices(0),
    m_positionLoc(positionLoc),
    m_normalLoc(normalLoc),
    m_texCoordLoc(texCoordLoc),
    m_drawMode(GL_TRIANGLES)
{
}